

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

void asmjit::ConstPool_addGap(ConstPool *self,size_t offset,size_t length)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint *puVar3;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar4;
  uint uVar5;
  ArchInfo AVar6;
  anon_union_4_2_424c626f_for_ArchInfo_0 aVar7;
  uint uVar8;
  Gap *pGVar9;
  uint8_t *puVar10;
  uint8_t uVar11;
  ArchInfo AVar12;
  uint8_t uVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  Zone *this;
  ArchInfo *this_00;
  ArchInfo AVar17;
  uint uVar18;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar19;
  anon_union_4_2_424c626f_for_ArchInfo_0 aVar20;
  size_t sVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar25;
  size_t __n;
  uint in_XCR0;
  undefined8 auStack_278 [68];
  ulong uStack_58;
  size_t sStack_50;
  long lStack_48;
  ulong uStack_40;
  ConstPool *pCStack_38;
  
  uVar24 = offset;
  if (length == 0) {
    return;
  }
LAB_00115662:
  if (length < 0x10) {
    if (7 < length) goto LAB_00115682;
    if (3 < length) goto LAB_0011569c;
    if (length != 1 && (uVar24 & 1) == 0) goto LAB_001156a8;
LAB_001156d6:
    sVar21 = 1;
    lVar23 = 0;
  }
  else if ((uVar24 & 0xf) == 0) {
    sVar21 = 0x10;
    lVar23 = 4;
  }
  else {
LAB_00115682:
    if ((uVar24 & 7) == 0) {
      sVar21 = 8;
      lVar23 = 3;
    }
    else {
LAB_0011569c:
      if ((uVar24 & 3) == 0) {
        sVar21 = 4;
        lVar23 = 2;
      }
      else {
        if ((uVar24 & 1) != 0) goto LAB_001156d6;
LAB_001156a8:
        sVar21 = 2;
        lVar23 = 1;
      }
    }
  }
  pGVar9 = self->_gapPool;
  if (pGVar9 == (Gap *)0x0) {
    this = self->_zone;
    pGVar9 = (Gap *)this->_ptr;
    if ((ulong)((long)this->_end - (long)pGVar9) < 0x18) {
      offset = (size_t)&DAT_00000018;
      pGVar9 = (Gap *)Zone::_alloc(this,0x18);
    }
    else {
      this->_ptr = (uint8_t *)(pGVar9 + 1);
      if ((Gap *)this->_end < pGVar9 + 1) {
        ConstPool_addGap();
        lVar22 = 0;
        this_00 = (ArchInfo *)offset;
        uStack_58 = length;
        sStack_50 = sVar21;
        lStack_48 = lVar23;
        uStack_40 = uVar24;
        pCStack_38 = self;
        memset((void *)offset,0,(size_t)this[6]._block);
        __n = 1;
        while ((&this->_end)[lVar22 * 3] == (uint8_t *)0x0) {
LAB_001157ed:
          __n = __n * 2;
          lVar22 = lVar22 + 1;
          if (lVar22 == 6) {
            return;
          }
        }
        lVar23 = 0;
        puVar10 = (&this->_end)[lVar22 * 3];
        while( true ) {
          while (puVar2 = *(uint8_t **)puVar10, puVar2 == (uint8_t *)0x0) {
            while( true ) {
              if (-1 < *(int *)(puVar10 + 0x10)) {
                this_00 = (ArchInfo *)
                          ((long)&((ArchInfo *)offset)->field_0 + (ulong)*(uint *)(puVar10 + 0x14));
                memcpy(this_00,puVar10 + 0x18,__n);
              }
              puVar10 = *(uint8_t **)(puVar10 + 8);
              if (puVar10 != (uint8_t *)0x0) break;
              if (lVar23 == 0) goto LAB_001157ed;
              puVar10 = (uint8_t *)auStack_278[lVar23 + 2];
              lVar23 = lVar23 + -1;
            }
          }
          if (lVar23 == 0x40) break;
          auStack_278[lVar23 + 3] = puVar10;
          lVar23 = lVar23 + 1;
          puVar10 = puVar2;
        }
        ConstPool::fill();
        lVar23 = 0;
        memset(this_00,0,0x98);
        ArchInfo::init(this_00,(EVP_PKEY_CTX *)0x2);
        this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 2;
        puVar3 = (uint *)cpuid_basic_info(0);
        uVar14 = *puVar3;
        AVar12.field_0 =
             (anon_union_4_2_424c626f_for_ArchInfo_0)
             ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar3 + 1))->_signature;
        AVar17.field_0 =
             (anon_union_4_2_424c626f_for_ArchInfo_0)
             ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar3 + 2))->_signature;
        AVar6.field_0 =
             (anon_union_4_2_424c626f_for_ArchInfo_0)
             ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar3 + 3))->_signature;
        this_00[1].field_0 = AVar12.field_0;
        this_00[2].field_0 = AVar17.field_0;
        this_00[3].field_0 = AVar6.field_0;
        while (((AVar12.field_0 !=
                 (anon_union_4_2_424c626f_for_ArchInfo_0)
                 ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(&DAT_00131ae4 + lVar23))->_signature ||
                (AVar17.field_0 !=
                 (anon_union_4_2_424c626f_for_ArchInfo_0)
                 ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(&DAT_00131ae8 + lVar23))->_signature))
               || (AVar6.field_0 !=
                   (anon_union_4_2_424c626f_for_ArchInfo_0)
                   ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(&DAT_00131aec + lVar23))->_signature)
               )) {
          lVar23 = lVar23 + 0x10;
          if (lVar23 == 0x40) {
            aVar7._signature = 0;
LAB_00115881:
            this_00[0x15].field_0 = aVar7;
            if (uVar14 != 0) {
              puVar3 = (uint *)cpuid_Version_info(1);
              uVar18 = *puVar3;
              uVar8 = puVar3[1];
              uVar5 = puVar3[2];
              uVar16 = puVar3[3];
              AVar17.field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 >> 8 & 0xf);
              this_00[0x16].field_0 = AVar17.field_0;
              AVar12.field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 >> 4 & 0xf);
              this_00[0x17].field_0 = AVar12.field_0;
              this_00[0x18].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 & 0xf);
              if (AVar17.field_0 == 0xf) {
                this_00[0x16].field_0 =
                     (anon_union_4_2_424c626f_for_ArchInfo_0)((uVar18 >> 0x14 & 0xff) + 0xf);
                this_00[0x17].field_0 =
                     (anon_union_4_2_424c626f_for_ArchInfo_0)
                     ((uint)AVar12.field_0 | uVar18 >> 0xc & 0xf0);
              }
              this_00[0x22].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 >> 0xc & 3);
              this_00[0x23].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar8 & 0xff);
              this_00[0x24].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar8 >> 5 & 0x7f8);
              this_00[0x25].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar8 >> 0x10 & 0xff)
              ;
              if ((uVar16 & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._gpCount;
                *puVar10 = *puVar10 | 0x10;
              }
              if ((uVar16 & 2) != 0) {
                this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x80;
              }
              if ((uVar16 & 8) != 0) {
                this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 4;
              }
              if ((uVar16 >> 9 & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._gpCount;
                *puVar10 = *puVar10 | 0x20;
              }
              if ((uVar16 >> 0xd & 1) != 0) {
                this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x80;
              }
              if ((uVar16 >> 0x13 & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._gpCount;
                *puVar10 = *puVar10 | 0x80;
              }
              if ((uVar16 >> 0x14 & 1) != 0) {
                this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 1;
              }
              if ((uVar16 >> 0x16 & 1) != 0) {
                this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 8;
              }
              if ((uVar16 >> 0x17 & 1) != 0) {
                this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x10;
              }
              if ((uVar16 >> 0x19 & 1) != 0) {
                this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x40;
              }
              if ((uVar16 >> 0x1a & 1) != 0) {
                puVar10 = &this_00[0x1b].field_0.field_0._subType;
                *puVar10 = *puVar10 | 0x20;
              }
              if ((uVar16 >> 0x1b & 1) != 0) {
                puVar10 = &this_00[0x1b].field_0.field_0._subType;
                *puVar10 = *puVar10 | 0x80;
              }
              if ((uVar16 >> 0x1e & 1) != 0) {
                puVar10 = &this_00[0x1b].field_0.field_0._subType;
                *puVar10 = *puVar10 | 1;
              }
              if ((uVar5 & 0x10) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._subType;
                *puVar10 = *puVar10 | 2;
              }
              if ((uVar5 & 0x20) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._subType;
                *puVar10 = *puVar10 | 1;
              }
              if ((uVar5 >> 8 & 1) != 0) {
                this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x40;
              }
              if ((short)uVar5 < 0) {
                this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x20;
              }
              if ((uVar5 >> 0x13 & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._subType;
                *puVar10 = *puVar10 | 8;
              }
              if ((uVar5 >> 0x17 & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                *puVar10 = *puVar10 | 0x20;
              }
              if ((uVar5 >> 0x18 & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                *puVar10 = *puVar10 | 8;
              }
              if ((uVar5 >> 0x19 & 1) != 0) {
                this_00[0x1a].field_0._signature = this_00[0x1a].field_0._signature | 0x4400000;
              }
              if ((uVar5 >> 0x1a & 1) != 0) {
                puVar10 = &this_00[0x1a].field_0.field_0._gpCount;
                *puVar10 = *puVar10 | 0xc;
              }
              if ((uVar5 >> 0x1c & 1) != 0) {
                this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 8;
              }
              uVar18 = 0;
              if (((~uVar16 & 0xc000000) == 0) &&
                 (uVar18 = in_XCR0, ((~in_XCR0 & 6) == 0 & (byte)(uVar16 >> 0x1c)) == 1)) {
                uVar8 = (uVar16 & 0x4000) << 5 | this_00[0x1b].field_0._signature;
                this_00[0x1b].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar8 | 0x10000);
                if ((uVar16 >> 0x1d & 1) != 0) {
                  this_00[0x1b].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar8 | 0x50000);
                }
              }
              if (6 < uVar14) {
                lVar23 = cpuid_Extended_Feature_Enumeration_info(7);
                uVar8 = *(uint *)(lVar23 + 4);
                uVar5 = *(uint *)(lVar23 + 8);
                uVar16 = *(uint *)(lVar23 + 0xc);
                if ((uVar8 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 0x80;
                }
                if ((uVar8 & 8) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 0x40;
                }
                if ((uVar8 & 0x10) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 8;
                }
                if ((char)uVar8 < '\0') {
                  puVar10 = &this_00[0x1b].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 8;
                }
                if ((uVar8 >> 8 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 0x80;
                }
                if ((uVar8 >> 9 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 0x40;
                }
                if ((uVar8 >> 0xb & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 0x10;
                }
                if ((uVar8 >> 0x12 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 2;
                }
                if ((uVar8 >> 0x13 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 1;
                }
                if ((uVar8 >> 0x14 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 4;
                }
                if ((uVar8 >> 0x16 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 0x80;
                }
                if ((uVar8 >> 0x17 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 0x10;
                }
                if ((uVar8 >> 0x18 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 0x20;
                }
                if ((uVar8 >> 0x1d & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 0x10;
                }
                if ((uVar16 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 2;
                }
                aVar7._signature = this_00[0x1b].field_0._signature | 0x20000000;
                if ((uVar8 & 0x810) == 0) {
                  aVar7._signature = this_00[0x1b].field_0._signature;
                }
                bVar15 = (byte)(uVar8 >> 5) & aVar7.field_0._gpSize & 1;
                if (((uVar8 & 0x810) != 0) || (bVar15 != 0)) {
                  aVar20._signature = aVar7._signature | 0x20000;
                  if (bVar15 == 0) {
                    aVar20 = aVar7;
                  }
                  this_00[0x1b].field_0._signature = (uint32_t)aVar20;
                }
                if (((~uVar18 & 0xe6) == 0 & (byte)(uVar8 >> 0x10)) == 1) {
                  uVar16 = (uVar5 & 4) << 8 |
                           uVar16 >> 5 & 0x200 |
                           (uVar16 & 2) << 7 |
                           uVar8 >> 0x19 & 0xffffffe0 |
                           uVar8 >> 0x1b & 2 | uVar8 >> 0x18 & 0xc | uVar8 >> 0xe & 0x80 |
                           uVar8 >> 0xd & 0x10 | this_00[0x1c].field_0._signature;
                  this_00[0x1c].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar16 | 1);
                  if ((uVar5 & 8) != 0) {
                    this_00[0x1c].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar16 | 0x801)
                    ;
                  }
                }
                if (0xc < uVar14) {
                  puVar3 = (uint *)cpuid_Processor_Extended_States_info(0xd);
                  if (((uVar8 >> 0xe & 1) != 0) && ((uVar18 & *puVar3 & 0x18) == 0x18)) {
                    puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                    *puVar10 = *puVar10 | 4;
                  }
                  puVar3 = (uint *)cpuid_Processor_Extended_States_info(0xd);
                  if ((*puVar3 & 1) != 0) {
                    puVar10 = &this_00[0x1b].field_0.field_0._subType;
                    *puVar10 = *puVar10 | 0x40;
                  }
                }
              }
            }
            paVar19 = &this_00[5].field_0;
            uVar14 = 0x80000000;
            aVar7._signature = 0x80000000;
            paVar25 = paVar19;
            do {
              if (uVar14 == 0) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_basic_info(0);
              }
              else if (uVar14 == 1) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Version_info(1);
              }
              else if (uVar14 == 2) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_cache_tlb_info(2);
              }
              else if (uVar14 == 3) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_serial_info(3);
              }
              else if (uVar14 == 4) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_Deterministic_Cache_Parameters_info(4);
              }
              else if (uVar14 == 5) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_MONITOR_MWAIT_Features_info(5);
              }
              else if (uVar14 == 6) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_Thermal_Power_Management_info(6);
              }
              else if (uVar14 == 7) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_Extended_Feature_Enumeration_info(7);
              }
              else if (uVar14 == 9) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Direct_Cache_Access_info(9)
                ;
              }
              else if (uVar14 == 10) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_Architectural_Performance_Monitoring_info(10);
              }
              else if (uVar14 == 0xb) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Extended_Topology_info(0xb)
                ;
              }
              else if (uVar14 == 0xd) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_Processor_Extended_States_info(0xd);
              }
              else if (uVar14 == 0xf) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_Quality_of_Service_info(0xf);
              }
              else if (uVar14 == 0x80000002) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_brand_part1_info(0x80000002);
              }
              else if (uVar14 == 0x80000003) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_brand_part2_info(0x80000003);
              }
              else if (uVar14 == 0x80000004) {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                         cpuid_brand_part3_info(0x80000004);
              }
              else {
                paVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid(uVar14);
              }
              aVar20 = (anon_union_4_2_424c626f_for_ArchInfo_0)paVar4->_signature;
              uVar18 = paVar4[1]._signature;
              uVar8 = paVar4[2]._signature;
              uVar5 = paVar4[3]._signature;
              switch(uVar14) {
              case 0x80000000:
                aVar7 = aVar20;
                if (0x80000007 < aVar20._signature) {
                  aVar7._signature = 0x80000008;
                }
                uVar14 = 0x80000000;
                break;
              case 0x80000001:
                if ((uVar5 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 4;
                }
                if ((uVar5 & 0x20) != 0) {
                  this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x20;
                }
                if ((uVar5 & 0x40) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 0x40;
                }
                if ((char)uVar5 < '\0') {
                  this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 2;
                }
                if ((uVar5 >> 8 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 1;
                }
                if ((uVar5 >> 0x15 & 1) != 0) {
                  puVar10 = &this_00[0x1b].field_0.field_0._gpCount;
                  *puVar10 = *puVar10 | 2;
                }
                if ((uVar8 >> 0x14 & 1) != 0) {
                  this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 4;
                }
                if ((uVar8 >> 0x15 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 0x10;
                }
                if ((uVar8 >> 0x16 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 0x40;
                }
                if ((uVar8 >> 0x1b & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 4;
                }
                if ((uVar8 >> 0x1e & 1) != 0) {
                  this_00[0x1a].field_0._signature = this_00[0x1a].field_0._signature | 0x1400000;
                }
                if ((int)uVar8 < 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._gpSize;
                  *puVar10 = *puVar10 | 0x80;
                }
                if (((this_00[0x1b].field_0._signature >> 0x10 & 1) != 0) &&
                   ((uVar5 & 0x10800) != 0)) {
                  this_00[0x1b].field_0 =
                       (anon_union_4_2_424c626f_for_ArchInfo_0)
                       ((uVar5 & 0x10000) << 4 | (uVar5 & 0x800) << 10 |
                       this_00[0x1b].field_0._signature);
                }
                uVar14 = 0x80000001;
                if ((this_00[0x15].field_0._signature == 2) && ((uVar5 & 0x10) != 0)) {
                  this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x10;
                }
                break;
              case 0x80000002:
              case 0x80000003:
              case 0x80000004:
                paVar25->_signature = (uint32_t)aVar20;
                paVar25[1]._signature = uVar18;
                paVar25[2]._signature = uVar5;
                paVar25[3]._signature = uVar8;
                paVar25 = paVar25 + 4;
                if (uVar14 == 0x80000004) {
                  uVar14 = 0x80000007;
                }
                break;
              case 0x80000008:
                uVar14 = 0x80000008;
                if ((uVar18 & 1) != 0) {
                  puVar10 = &this_00[0x1a].field_0.field_0._subType;
                  *puVar10 = *puVar10 | 0x40;
                }
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 <= aVar7._signature);
            puVar10 = &this_00[5].field_0.field_0._subType;
            uVar11 = '\0';
            do {
              uVar1 = ((anon_struct_4_4_3fa876f7_for_anon_union_4_2_424c626f_for_ArchInfo_0_0 *)
                      (puVar10 + -1))->_type;
              ((anon_struct_4_4_3fa876f7_for_anon_union_4_2_424c626f_for_ArchInfo_0_0 *)
              (puVar10 + -1))->_type = '\0';
              if (uVar1 == ' ') {
                uVar13 = '@';
                if (((uVar11 != '@') && (uVar13 = uVar11, *puVar10 != ' ')) && (*puVar10 != '@'))
                goto LAB_00115db8;
              }
              else {
                if (uVar1 == '\0') {
                  (paVar19->field_0)._type = '\0';
                  lVar23 = sysconf(0x54);
                  aVar7._signature = 1;
                  if (1 < lVar23) {
                    aVar7._signature = (uint32_t)lVar23;
                  }
                  this_00[0x19].field_0 = aVar7;
                  return;
                }
LAB_00115db8:
                (paVar19->field_0)._type = uVar1;
                paVar19 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)&(paVar19->field_0)._subType;
                uVar13 = uVar1;
              }
              puVar10 = puVar10 + 1;
              uVar11 = uVar13;
            } while( true );
          }
        }
        aVar7 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)
                 (&x86GetCpuVendorID(char_const*)::vendorList + lVar23);
        goto LAB_00115881;
      }
    }
    if (pGVar9 == (Gap *)0x0) {
      return;
    }
  }
  else {
    self->_gapPool = pGVar9->_next;
  }
  pGVar9->_next = self->_gaps[lVar23];
  self->_gaps[lVar23] = pGVar9;
  pGVar9->_offset = uVar24;
  pGVar9->_length = sVar21;
  length = length - sVar21;
  uVar24 = uVar24 + sVar21;
  if (length == 0) {
    return;
  }
  goto LAB_00115662;
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t length) noexcept {
  ASMJIT_ASSERT(length > 0);

  while (length > 0) {
    size_t gapIndex;
    size_t gapLength;

      gapIndex = ConstPool::kIndex16;
    if (length >= 16 && Utils::isAligned<size_t>(offset, 16)) {
      gapLength = 16;
    }
    else if (length >= 8 && Utils::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapLength = 8;
    }
    else if (length >= 4 && Utils::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapLength = 4;
    }
    else if (length >= 2 && Utils::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapLength = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapLength = 1;
    }

    // We don't have to check for errors here, if this failed nothing really
    // happened (just the gap won't be visible) and it will fail again at
    // place where checking will cause kErrorNoHeapMemory.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap) return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_length = gapLength;

    offset += gapLength;
    length -= gapLength;
  }
}